

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

void __thiscall transaction_tests::tx_no_inputs::test_method(tx_no_inputs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  CMutableTransaction empty;
  TxValidationState state;
  check_type cVar7;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  lazy_ostream local_190;
  undefined1 *local_180;
  char **local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  CMutableTransaction local_138;
  undefined1 local_100 [16];
  undefined1 local_f0 [112];
  ValidationState<TxValidationResult> local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_138);
  paVar1 = &local_80.m_reject_reason.field_2;
  local_80.m_mode = M_VALID;
  local_80.m_result = TX_RESULT_UNSET;
  local_80.m_reject_reason._M_string_length = 0;
  local_80.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_80.m_debug_message.field_2;
  local_80.m_debug_message._M_string_length = 0;
  local_80.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17b;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_80.m_reject_reason._M_dataplus._M_p = (pointer)paVar1;
  local_80.m_debug_message._M_dataplus._M_p = (pointer)paVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  CTransaction::CTransaction((CTransaction *)local_100,&local_138);
  bVar3 = CheckTransaction((CTransaction *)local_100,(TxValidationState *)&local_80);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190.m_empty = false;
  local_190._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389ed0;
  local_180 = boost::unit_test::lazy_ostream::inst;
  local_178 = (char **)0xf20192;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_198 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_190,1,1,WARN,_cVar7,(size_t)&local_1a0,0x17b);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_f0 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_100);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17c;
  file_00.m_begin = (iterator)&local_1b0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c0,
             msg_00);
  local_100._0_8_ = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,local_80.m_reject_reason._M_dataplus._M_p,
             local_80.m_reject_reason._M_dataplus._M_p + local_80.m_reject_reason._M_string_length);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     "bad-txns-vin-empty");
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178 = &local_1d0;
  local_1d0 = "state.GetRejectReason() == \"bad-txns-vin-empty\"";
  local_1c8 = "";
  local_190.m_empty = false;
  local_190._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_180 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_190,1,0,WARN,0xf1ff6e,(size_t)&stack0xfffffffffffffe20,0x17c);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if ((pointer)local_100._0_8_ != (pointer)local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_f0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_debug_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_80.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_80.m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_reject_reason._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_80.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_80.m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_138.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_138.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_no_inputs)
{
    CMutableTransaction empty;

    TxValidationState state;
    BOOST_CHECK_MESSAGE(!CheckTransaction(CTransaction(empty), state), "Transaction with no inputs should be invalid.");
    BOOST_CHECK(state.GetRejectReason() == "bad-txns-vin-empty");
}